

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall
cxxopts::OptionValue::parse_default
          (OptionValue *this,shared_ptr<const_cxxopts::OptionDetails> *details)

{
  element_type *this_00;
  element_type *peVar1;
  element_type *peVar2;
  shared_ptr<const_cxxopts::OptionDetails> *in_RDI;
  OptionValue *unaff_retaddr;
  
  ensure_value(unaff_retaddr,in_RDI);
  *(undefined1 *)
   &in_RDI[2].super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       1;
  this_00 = std::
            __shared_ptr_access<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x130303);
  peVar1 = (element_type *)OptionDetails::long_names_abi_cxx11_(this_00);
  (in_RDI->super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       peVar1;
  peVar2 = std::__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x13031b);
  (*peVar2->_vptr_Value[4])();
  return;
}

Assistant:

void
  parse_default(const std::shared_ptr<const OptionDetails>& details)
  {
    ensure_value(details);
    m_default = true;
    m_long_names = &details->long_names();
    m_value->parse();
  }